

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Iterator __thiscall
Map<unsigned_int,_Error::Private::Str>::find(Map<unsigned_int,_Error::Private::Str> *this,uint *key)

{
  Item *pIVar1;
  Item **ppIVar2;
  long lVar3;
  
  ppIVar2 = &this->root;
  while( true ) {
    pIVar1 = *ppIVar2;
    if (pIVar1 == (Item *)0x0) {
      return (Iterator)(this->_end).item;
    }
    lVar3 = 0x28;
    if ((*key <= pIVar1->key) && (lVar3 = 0x20, pIVar1->key <= *key)) break;
    ppIVar2 = (Item **)((long)&pIVar1->key + lVar3);
  }
  return (Iterator)pIVar1;
}

Assistant:

Iterator find(const T& key) const
  {
    for(Item* item = root; item; )
    {
      if(key > item->key)
      {
        item = item->right;
        continue;
      }
      else if(key < item->key)
      {
        item = item->left;
        continue;
      }
      else
        return item;
    }
    return _end;
  }